

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawpagetexture.cpp
# Opt level: O1

BYTE * __thiscall FRawPageTexture::GetColumn(FRawPageTexture *this,uint column,Span **spans_out)

{
  ushort uVar1;
  uint uVar2;
  
  if (this->Pixels == (BYTE *)0x0) {
    MakeTexture(this);
  }
  uVar1 = (this->super_FTexture).Width;
  if (spans_out != (Span **)0x0) {
    *spans_out = DummySpans;
  }
  uVar2 = column % 0x140;
  if (column < uVar1) {
    uVar2 = column;
  }
  return this->Pixels + (this->super_FTexture).Height * uVar2;
}

Assistant:

const BYTE *FRawPageTexture::GetColumn (unsigned int column, const Span **spans_out)
{
	if (Pixels == NULL)
	{
		MakeTexture ();
	}
	if ((unsigned)column >= (unsigned)Width)
	{
		column %= 320;
	}
	if (spans_out != NULL)
	{
		*spans_out = DummySpans;
	}
	return Pixels + column*Height;
}